

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::verifyColorData
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size,
          GLuint n_layer)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar5;
  GLuint local_48 [2];
  GLuint expected [4];
  GLuint *result_data;
  GLuint result_data_size;
  bool result;
  Functions *gl;
  GLuint n_layer_local;
  _texture_size *texture_size_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  auVar1 = ZEXT416(texture_size->m_size * texture_size->m_size * 4) * ZEXT816(4);
  uVar5 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  expected._8_8_ = operator_new__(uVar5);
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))
            (0,0,texture_size->m_size,texture_size->m_size,0x8d99,0x1404,expected._8_8_);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x415);
  local_48[1] = 0;
  expected[0] = 0;
  expected[1] = 1;
  local_48[0] = n_layer;
  bVar2 = verifyImage<unsigned_int,4u>
                    (texture_size->m_size,texture_size->m_size,local_48,(uint *)expected._8_8_);
  if ((expected._8_8_ != 0) && (expected._8_8_ != 0)) {
    operator_delete__((void *)expected._8_8_);
  }
  return bVar2;
}

Assistant:

bool TextureCubeMapArrayColorDepthAttachmentsTest::verifyColorData(const _texture_size& texture_size,
																   glw::GLuint			n_layer)
{
	/* Allocate buffer for the data we will retrieve from the implementation */
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  result		   = false;
	const glw::GLuint	 result_data_size = texture_size.m_size * texture_size.m_size * 4;
	glw::GLuint*		  result_data	  = new glw::GLuint[result_data_size];

	DE_ASSERT(result_data != NULL);

	/* Read the data */
	gl.readPixels(0, /* x */
				  0, /* y */
				  texture_size.m_size, texture_size.m_size, GL_RGBA_INTEGER, m_color_type, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	glw::GLuint expected[4] = { n_layer, 0, 0, 1 };

	/* Verify image, expected value is layer index */
	result = verifyImage<glw::GLuint, 4>(texture_size.m_size, texture_size.m_size, expected, result_data);

	/* Release the buffer */
	if (result_data != NULL)
	{
		delete[] result_data;

		result_data = NULL;
	}

	return result;
}